

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathNodeSetAddNs(xmlNodeSetPtr cur,xmlNodePtr node,xmlNsPtr ns)

{
  int iVar1;
  int iVar2;
  xmlNodePtr *ppxVar3;
  xmlNodePtr pxVar4;
  char *extra;
  long lVar5;
  
  if (node == (xmlNodePtr)0x0) {
    return -1;
  }
  if (cur == (xmlNodeSetPtr)0x0) {
    return -1;
  }
  if (ns == (xmlNsPtr)0x0) {
    return -1;
  }
  if (ns->type != XML_NAMESPACE_DECL) {
    return -1;
  }
  if (node->type != XML_ELEMENT_NODE) {
    return -1;
  }
  iVar2 = cur->nodeNr;
  if (0 < iVar2) {
    lVar5 = 0;
    do {
      pxVar4 = cur->nodeTab[lVar5];
      if ((((pxVar4 != (xmlNodePtr)0x0) && (pxVar4->type == XML_NAMESPACE_DECL)) &&
          ((xmlNodePtr)pxVar4->_private == node)) &&
         (iVar2 = xmlStrEqual(ns->prefix,(xmlChar *)pxVar4->children), iVar2 != 0)) {
        return 0;
      }
      lVar5 = lVar5 + 1;
      iVar2 = cur->nodeNr;
    } while (lVar5 < iVar2);
  }
  iVar1 = cur->nodeMax;
  if ((long)iVar1 == 0) {
    ppxVar3 = (xmlNodePtr *)(*xmlMalloc)(0x50);
    cur->nodeTab = ppxVar3;
    if (ppxVar3 != (xmlNodePtr *)0x0) {
      ppxVar3[8] = (xmlNodePtr)0x0;
      ppxVar3[9] = (xmlNodePtr)0x0;
      ppxVar3[6] = (xmlNodePtr)0x0;
      ppxVar3[7] = (xmlNodePtr)0x0;
      ppxVar3[4] = (xmlNodePtr)0x0;
      ppxVar3[5] = (xmlNodePtr)0x0;
      ppxVar3[2] = (xmlNodePtr)0x0;
      ppxVar3[3] = (xmlNodePtr)0x0;
      *ppxVar3 = (xmlNodePtr)0x0;
      ppxVar3[1] = (xmlNodePtr)0x0;
      cur->nodeMax = 10;
      goto LAB_001dfdb6;
    }
  }
  else {
    if (iVar2 != iVar1) {
LAB_001dfdb6:
      pxVar4 = xmlXPathNodeSetDupNs(node,ns);
      iVar2 = cur->nodeNr;
      cur->nodeNr = iVar2 + 1;
      cur->nodeTab[iVar2] = pxVar4;
      return 0;
    }
    if (9999999 < iVar1) {
      extra = "growing nodeset hit limit\n";
      goto LAB_001dfddd;
    }
    ppxVar3 = (xmlNodePtr *)(*xmlRealloc)(cur->nodeTab,(long)iVar1 << 4);
    if (ppxVar3 != (xmlNodePtr *)0x0) {
      cur->nodeMax = cur->nodeMax << 1;
      cur->nodeTab = ppxVar3;
      goto LAB_001dfdb6;
    }
  }
  extra = "growing nodeset\n";
LAB_001dfddd:
  xmlXPathErrMemory((xmlXPathContextPtr)0x0,extra);
  return -1;
}

Assistant:

int
xmlXPathNodeSetAddNs(xmlNodeSetPtr cur, xmlNodePtr node, xmlNsPtr ns) {
    int i;


    if ((cur == NULL) || (ns == NULL) || (node == NULL) ||
        (ns->type != XML_NAMESPACE_DECL) ||
	(node->type != XML_ELEMENT_NODE))
	return(-1);

    /* @@ with_ns to check whether namespace nodes should be looked at @@ */
    /*
     * prevent duplicates
     */
    for (i = 0;i < cur->nodeNr;i++) {
        if ((cur->nodeTab[i] != NULL) &&
	    (cur->nodeTab[i]->type == XML_NAMESPACE_DECL) &&
	    (((xmlNsPtr)cur->nodeTab[i])->next == (xmlNsPtr) node) &&
	    (xmlStrEqual(ns->prefix, ((xmlNsPtr)cur->nodeTab[i])->prefix)))
	    return(0);
    }

    /*
     * grow the nodeTab if needed
     */
    if (cur->nodeMax == 0) {
        cur->nodeTab = (xmlNodePtr *) xmlMalloc(XML_NODESET_DEFAULT *
					     sizeof(xmlNodePtr));
	if (cur->nodeTab == NULL) {
	    xmlXPathErrMemory(NULL, "growing nodeset\n");
	    return(-1);
	}
	memset(cur->nodeTab, 0 ,
	       XML_NODESET_DEFAULT * (size_t) sizeof(xmlNodePtr));
        cur->nodeMax = XML_NODESET_DEFAULT;
    } else if (cur->nodeNr == cur->nodeMax) {
        xmlNodePtr *temp;

        if (cur->nodeMax >= XPATH_MAX_NODESET_LENGTH) {
            xmlXPathErrMemory(NULL, "growing nodeset hit limit\n");
            return(-1);
        }
	temp = (xmlNodePtr *) xmlRealloc(cur->nodeTab, cur->nodeMax * 2 *
				      sizeof(xmlNodePtr));
	if (temp == NULL) {
	    xmlXPathErrMemory(NULL, "growing nodeset\n");
	    return(-1);
	}
        cur->nodeMax *= 2;
	cur->nodeTab = temp;
    }
    /* TODO: Check memory error. */
    cur->nodeTab[cur->nodeNr++] = xmlXPathNodeSetDupNs(node, ns);
    return(0);
}